

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_file_reader.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  vector<char,_std::allocator<char>_> line;
  shared_ptr<diffusion::Reader> file_reader;
  allocator<char> local_41;
  string local_40;
  Reader *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10a1a0);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," diffusion_file",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,argv[1],&local_41);
    local_20 = diffusion::create_file_reader(&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<diffusion::Reader*>
              (&local_18,local_20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    while( true ) {
      iVar1 = (**local_20->_vptr_Reader)();
      if ((char)iVar1 == '\0') break;
      (*local_20->_vptr_Reader[1])(&local_40);
      std::ostream::write((char *)&std::cout,(long)local_40._M_dataplus._M_p);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      if (local_40._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_40._M_dataplus._M_p,
                        local_40.field_2._M_allocated_capacity - (long)local_40._M_dataplus._M_p);
      }
    }
    if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
    }
  }
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
    if (argc < 2) {
        std::cerr << "Usage: " << argv[0] << " diffusion_file" << std::endl;
        return 0;
    }
    auto file_reader = std::shared_ptr<diffusion::Reader>(diffusion::create_file_reader(argv[1]));
    while (file_reader->can_read()) {
        auto line = file_reader->read();
        std::cout.write(line.data(), line.size());
        std::cout << std::endl;
    }
    return 0;
}